

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSharedMemoryFileLockMgr::GetLockControllerForFile
          (CSharedMemoryFileLockMgr *this,CPalThread *pThread,LPCSTR szFileName,DWORD dwAccessRights
          ,DWORD dwShareMode,IFileLockController **ppLockController)

{
  uint uVar1;
  IFileLockController IVar2;
  PAL_ERROR PVar3;
  LPVOID pvVar4;
  IFileLockController *pIVar5;
  bool bVar6;
  IFileLockController local_40;
  SHMPTR shmFileLocks;
  
  local_40._vptr_IFileLockController = (_func_int **)0x0;
  SHMLock();
  PVar3 = FILEGetSHMFileLocks(szFileName,(SHMPTR *)&local_40,0);
  IVar2._vptr_IFileLockController = local_40._vptr_IFileLockController;
  if (PVar3 != 0) {
    pIVar5 = (IFileLockController *)0x0;
    goto LAB_00331334;
  }
  shmFileLocks = (SHMPTR)ppLockController;
  if (local_40._vptr_IFileLockController == (_func_int **)0x0) {
    pvVar4 = (LPVOID)0x0;
    bVar6 = false;
  }
  else {
    pvVar4 = SHMPtrToPtr((SHMPTR)local_40._vptr_IFileLockController);
    bVar6 = pvVar4 == (LPVOID)0x0;
  }
  if ((bool)(pvVar4 == (LPVOID)0x0 | bVar6)) {
    pIVar5 = (IFileLockController *)0x0;
    fprintf(_stderr,"] %s %s:%d","GetLockControllerForFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
            ,0x78);
    fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
    PVar3 = 0x54f;
    ppLockController = (IFileLockController **)shmFileLocks;
    goto LAB_00331334;
  }
  uVar1 = *(uint *)((long)pvVar4 + 0x28);
  if (uVar1 == 0) {
LAB_00331327:
    pIVar5 = (IFileLockController *)0x0;
    PVar3 = 0x20;
    ppLockController = (IFileLockController **)shmFileLocks;
  }
  else {
    if (uVar1 == 0xffffffff) {
      *(DWORD *)((long)pvVar4 + 0x28) = dwShareMode;
    }
    else if (((((((int)dwAccessRights < 0) && ((uVar1 & 1) == 0)) ||
               (((dwAccessRights >> 0x1e & 1) != 0 && ((uVar1 & 2) == 0)))) ||
              (((dwShareMode & 3) == 1 && ((uVar1 & 1) == 0)))) ||
             (((dwShareMode & 3) == 2 && ((uVar1 & 2) == 0)))) ||
            ((((dwShareMode & 1) == 0 && (*(int *)((long)pvVar4 + 0x2c) != 0)) ||
             (((dwShareMode & 2) == 0 && (*(int *)((long)pvVar4 + 0x30) != 0))))))
    goto LAB_00331327;
    if (((dwShareMode & 1) != 0) && ((*(uint *)((long)pvVar4 + 0x28) & 1) == 0)) {
      dwShareMode = *(uint *)((long)pvVar4 + 0x28);
    }
    if (((dwShareMode & 2) != 0) && ((*(uint *)((long)pvVar4 + 0x28) & 2) == 0)) {
      dwShareMode = *(uint *)((long)pvVar4 + 0x28);
    }
    pIVar5 = (IFileLockController *)InternalMalloc(0x18);
    if (pIVar5 == (IFileLockController *)0x0) {
      pIVar5 = (IFileLockController *)0x0;
    }
    else {
      pIVar5->_vptr_IFileLockController = (_func_int **)&PTR_GetTransactionLock_014d7690;
      *(DWORD *)&pIVar5[1]._vptr_IFileLockController = dwAccessRights;
      pIVar5[2]._vptr_IFileLockController = IVar2._vptr_IFileLockController;
    }
    ppLockController = (IFileLockController **)shmFileLocks;
    if (pIVar5 == (IFileLockController *)0x0) {
      PVar3 = 0xe;
      pIVar5 = (IFileLockController *)0x0;
    }
    else {
      local_40._vptr_IFileLockController = (_func_int **)0x0;
      *(DWORD *)((long)pvVar4 + 0x28) = dwShareMode;
      if ((int)dwAccessRights < 0) {
        *(int *)((long)pvVar4 + 0x2c) = *(int *)((long)pvVar4 + 0x2c) + 1;
      }
      if ((dwAccessRights >> 0x1e & 1) != 0) {
        *(int *)((long)pvVar4 + 0x30) = *(int *)((long)pvVar4 + 0x30) + 1;
      }
    }
  }
LAB_00331334:
  if (PVar3 == 0) {
    *ppLockController = pIVar5;
  }
  else {
    if (pIVar5 != (IFileLockController *)0x0) {
      (*pIVar5->_vptr_IFileLockController[3])(pIVar5);
    }
    if (local_40._vptr_IFileLockController != (_func_int **)0x0) {
      FILECleanUpLockedRgn((SHMPTR)local_40._vptr_IFileLockController,0,(PVOID)0x0);
    }
  }
  SHMRelease();
  return PVar3;
}

Assistant:

PAL_ERROR
CSharedMemoryFileLockMgr::GetLockControllerForFile(
    CPalThread *pThread,                // IN, OPTIONAL
    LPCSTR szFileName,
    DWORD dwAccessRights,
    DWORD dwShareMode,
    IFileLockController **ppLockController  // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMPTR shmFileLocks = SHMNULL;
    SHMFILELOCKS* fileLocks = NULL;
    CSharedMemoryFileLockController *pController = NULL;

    SHMLock();

    palError = FILEGetSHMFileLocks(szFileName, &shmFileLocks, FALSE);
    if (NO_ERROR != palError)
    {
        goto GetLockControllerForFileExit;
    }

    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, fileLocks, shmFileLocks) == FALSE || fileLocks == NULL)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto GetLockControllerForFileExit;
    }
        
    if(SHARE_MODE_NOT_INITALIZED == fileLocks->share_mode)
    {
        /* this is the first time this file is open */
        fileLocks->share_mode = (int) dwShareMode;
    }
    /* start checking for dwDesired access and dwShareMode conditions */
    else if(0 == fileLocks->share_mode)
    {
        /* file is exclusively locked */
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;
    }
    /* check for if the desired access is allowed by the share mode */
    else if( (dwAccessRights & GENERIC_READ) && 
             !(fileLocks->share_mode & FILE_SHARE_READ) )
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    else if( (dwAccessRights & GENERIC_WRITE) && 
             !(fileLocks->share_mode & FILE_SHARE_WRITE) )
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    /* The case when changing to a conflicting share mode is particular.
       The general rule is: changing from conflicting share mode is invalid
       (i.e changing from FILE_SHARE_WRITE to FILE_SHARE_READ is invalid).
       However, if one of the share flags is the same
       (i.e changing from FILE_SHARE_WRITE to FILE_SHARE_READ | FILE_SHARE_WRITE)
       the result is valid. (Please note that FILE_SHARE_READ is ignored
       in this case).
    */
    else if( (dwShareMode & FILE_SHARE_READ) && 
             !(dwShareMode & FILE_SHARE_WRITE) &&
             !(fileLocks->share_mode & FILE_SHARE_READ))
                         
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    else if( (dwShareMode & FILE_SHARE_WRITE) && 
             !(dwShareMode & FILE_SHARE_READ) &&
             !(fileLocks->share_mode & FILE_SHARE_WRITE))
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    /* Changing to a less permissive sharing permissions is valid
       if the file handle doesn't have an access right that conflicts with
       the sharing permissions we are trying to set
       (ex: changing from FILE_SHARE_READ|FILE_SHARE_WRITE to FILE_SHARE_WRITE
       isn't valid if the file descriptor still has a GENERIC_READ permission).
    */     
    else if( (fileLocks->nbReadAccess) && 
             !(dwShareMode & FILE_SHARE_READ) )
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    else if( (fileLocks->nbWriteAccess) && 
             !(dwShareMode & FILE_SHARE_WRITE) )
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }

    /* we are trying to change to a less restrictive sharing permission set 
       keep the current permissions */  
    if( (dwShareMode & FILE_SHARE_READ) && 
              !(fileLocks->share_mode & FILE_SHARE_READ) )
    {
        dwShareMode = fileLocks->share_mode;
    }

    if( (dwShareMode & FILE_SHARE_WRITE) && 
              !(fileLocks->share_mode & FILE_SHARE_WRITE) )
    {
        dwShareMode = fileLocks->share_mode;
    }

    pController = InternalNew<CSharedMemoryFileLockController>(dwAccessRights, shmFileLocks);
    if (NULL == pController)
    {
        palError = ERROR_OUTOFMEMORY;
        goto GetLockControllerForFileExit;
    }

    //
    // pController now owns the shared memory pointer, so make sure we
    // don't attempt to free it below.
    //

    shmFileLocks = SHMNULL;

    /* set the share mode again, it's possible that the share mode is now more
    restrictive than the previous mode set. */
    fileLocks->share_mode = dwShareMode;
    if( dwAccessRights & GENERIC_READ )
    {
        fileLocks->nbReadAccess++;  
    }
    if( dwAccessRights & GENERIC_WRITE )
    {
        fileLocks->nbWriteAccess++;
    }

    // ************** NOTE **************
    // If you add any error paths after this point you must communicate the value of dwAccessRights to
    // FILECleanUpLockedRgn() in the cleanup code below so that it can correctly undo the changes to
    // fileLocks->nbReadAccess and nbWriteAccess made above.
    // ************** NOTE **************

GetLockControllerForFileExit:

    if (NO_ERROR == palError)
    {
        *ppLockController = pController;
    }
    else
    {
        if (NULL != pController)
        {
            pController->ReleaseController();
        }

        if (SHMNULL != shmFileLocks)
        {
            FILECleanUpLockedRgn(
                shmFileLocks,
                0,
                NULL
                );
        }
    }

    SHMRelease();

    return palError;
}